

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_zero_lattice_digital_filter.cc
# Opt level: O2

bool __thiscall
sptk::AllZeroLatticeDigitalFilter::Run
          (AllZeroLatticeDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  double *pdVar4;
  bool bVar5;
  pointer pdVar6;
  uint uVar7;
  ulong uVar8;
  pointer pdVar9;
  size_type __new_size;
  ulong uVar10;
  double dVar11;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar5 = false;
  if ((buffer != (Buffer *)0x0) && (bVar5 = false, filter_output != (double *)0x0)) {
    uVar7 = this->num_filter_order_;
    __new_size = (size_type)(int)uVar7;
    bVar5 = false;
    if ((long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == __new_size + 1) {
      pdVar6 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar6 >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
        pdVar3 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar6 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (pdVar9 = pdVar6; pdVar9 != pdVar3; pdVar9 = pdVar9 + 1) {
          *pdVar9 = 0.0;
        }
        uVar7 = this->num_filter_order_;
      }
      pdVar4 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar11 = filter_input;
      if (uVar7 != 0) {
        uVar10 = 0;
        uVar8 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar8 = uVar10;
        }
        for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          dVar1 = pdVar6[uVar10];
          dVar2 = pdVar4[uVar10 + 1];
          pdVar6[uVar10] = filter_input;
          filter_input = dVar2 * dVar11 + dVar1;
          dVar11 = dVar11 + dVar2 * dVar1;
        }
      }
      *filter_output = dVar11 * *pdVar4;
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool AllZeroLatticeDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, AllZeroLatticeDigitalFilter::Buffer* buffer) const {
  // Check inputs
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  if (0 == num_filter_order_) {
    *filter_output = filter_input * filter_coefficients[0];
    return true;
  }

  const double* k(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(filter_input);
  double next_d(filter_input);

  // Apply all-zero lattice filter.
  for (int m(0); m < num_filter_order_; ++m) {
    const double tmp(d[m] + k[m] * sum);
    sum += k[m] * d[m];
    d[m] = next_d;
    next_d = tmp;
  }

  // Save result.
  *filter_output = sum * filter_coefficients[0];

  return true;
}